

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

sudoku_policko __thiscall Sudoku::policko(Sudoku *this,int x,int y)

{
  int y_local;
  int x_local;
  Sudoku *this_local;
  sudoku_policko err;
  
  if ((((x < 0) || (8 < x)) || (y < 0)) || (8 < y)) {
    this_local._4_4_ = (sudoku_policko)((uint)this_local._4_4_ & 0xffffffdf | 0x20);
  }
  else {
    this_local._4_4_ = (this->s).pole[y * 9 + x];
  }
  return this_local._4_4_;
}

Assistant:

sudoku_policko Sudoku::policko (int x,int y)
{
  if(0 <= x && x < 9)
    if(0 <= y && y < 9)
      return s.pole[y*9+x];
  sudoku_policko err;
  err.error = true;
  return err;
}